

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::GenerateBlockSymbol_const*>::
emplace_back<slang::ast::GenerateBlockSymbol_const*const&>
          (SmallVectorBase<slang::ast::GenerateBlockSymbol_const*> *this,GenerateBlockSymbol **args)

{
  long lVar1;
  reference ppGVar2;
  pointer ppGVar3;
  
  lVar1 = *(long *)(this + 8);
  ppGVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppGVar3 = emplaceRealloc<slang::ast::GenerateBlockSymbol_const*const&>(this,ppGVar3,args);
    return ppGVar3;
  }
  *ppGVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppGVar2 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::back
                      ((SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*> *)this);
  return ppGVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }